

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IPF.cpp
# Opt level: O2

shared_ptr<Storage::Disk::Track> __thiscall
Storage::Disk::IPF::get_track_at_position(IPF *this,Address address)

{
  IPF *this_00;
  uint32_t uVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  _Base_ptr p_Var6;
  byte bVar7;
  uint32_t uVar8;
  pointer pBVar9;
  pointer pBVar10;
  pointer pBVar11;
  Time bit_length;
  size_t sVar12;
  long lVar13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  size_t __n;
  size_t __n_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var14;
  BlockDescriptor *__cur;
  long lVar15;
  pointer pBVar16;
  _Base_ptr __n_01;
  IPF *this_01;
  char *this_02;
  pointer this_03;
  _Vector_base<BlockDescriptor,_std::allocator<BlockDescriptor>_> *p_Var17;
  ulong uVar18;
  shared_ptr<Storage::Disk::Track> sVar19;
  vector<BlockDescriptor,_std::allocator<BlockDescriptor>_> local_a8;
  pointer local_88;
  Address local_80;
  ulong local_78;
  _Base_ptr local_70;
  vector<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_> segments;
  pointer local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_40;
  Address address_local;
  
  local_70 = (_Base_ptr)
             std::
             _Rb_tree<Storage::Disk::Track::Address,_std::pair<const_Storage::Disk::Track::Address,_Storage::Disk::IPF::TrackDescription>,_std::_Select1st<std::pair<const_Storage::Disk::Track::Address,_Storage::Disk::IPF::TrackDescription>_>,_std::less<Storage::Disk::Track::Address>,_std::allocator<std::pair<const_Storage::Disk::Track::Address,_Storage::Disk::IPF::TrackDescription>_>_>
             ::find((_Rb_tree<Storage::Disk::Track::Address,_std::pair<const_Storage::Disk::Track::Address,_Storage::Disk::IPF::TrackDescription>,_std::_Select1st<std::pair<const_Storage::Disk::Track::Address,_Storage::Disk::IPF::TrackDescription>_>,_std::less<Storage::Disk::Track::Address>,_std::allocator<std::pair<const_Storage::Disk::Track::Address,_Storage::Disk::IPF::TrackDescription>_>_>
                     *)((long)address + 0x100),&address_local);
  if ((local_70 == (_Base_ptr)((long)address + 0x108)) ||
     (__n_01 = local_70[1]._M_parent, __n_01 == (_Base_ptr)0x0)) {
    (this->super_DiskImage)._vptr_DiskImage = (_func_int **)0x0;
    (this->super_TypeDistinguisher)._vptr_TypeDistinguisher = (_func_int **)0x0;
    _Var14._M_pi = extraout_RDX;
  }
  else {
    this_00 = (IPF *)((long)address + 0x10);
    this_01 = this_00;
    local_80 = address;
    FileHolder::seek((FileHolder *)this_00,(long)__n_01,0);
    local_a8.super__Vector_base<BlockDescriptor,_std::allocator<BlockDescriptor>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_a8.super__Vector_base<BlockDescriptor,_std::allocator<BlockDescriptor>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_a8.super__Vector_base<BlockDescriptor,_std::allocator<BlockDescriptor>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    p_Var17 = (_Vector_base<BlockDescriptor,_std::allocator<BlockDescriptor>_> *)
              (ulong)local_70[2]._M_color;
    if (p_Var17 != (_Vector_base<BlockDescriptor,_std::allocator<BlockDescriptor>_> *)0x0) {
      pBVar9 = std::_Vector_base<BlockDescriptor,_std::allocator<BlockDescriptor>_>::_M_allocate
                         (p_Var17,(size_t)__n_01);
      this_01 = (IPF *)0x0;
      __n_01 = (_Base_ptr)0x0;
      std::_Vector_base<BlockDescriptor,_std::allocator<BlockDescriptor>_>::_M_deallocate
                ((_Vector_base<BlockDescriptor,_std::allocator<BlockDescriptor>_> *)0x0,(pointer)0x0
                 ,__n);
      local_a8.super__Vector_base<BlockDescriptor,_std::allocator<BlockDescriptor>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = pBVar9 + (long)p_Var17;
      local_a8.super__Vector_base<BlockDescriptor,_std::allocator<BlockDescriptor>_>._M_impl.
      super__Vector_impl_data._M_finish = pBVar9;
    }
    uVar18 = 0;
    pBVar9 = local_a8.super__Vector_base<BlockDescriptor,_std::allocator<BlockDescriptor>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    this_03 = local_a8.super__Vector_base<BlockDescriptor,_std::allocator<BlockDescriptor>_>._M_impl
              .super__Vector_impl_data._M_finish;
    local_a8.super__Vector_base<BlockDescriptor,_std::allocator<BlockDescriptor>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_a8.super__Vector_base<BlockDescriptor,_std::allocator<BlockDescriptor>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_88 = local_a8.super__Vector_base<BlockDescriptor,_std::allocator<BlockDescriptor>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    while ((_Rb_tree_color)uVar18 < local_70[2]._M_color) {
      local_78 = uVar18;
      if (local_a8.super__Vector_base<BlockDescriptor,_std::allocator<BlockDescriptor>_>._M_impl.
          super__Vector_impl_data._M_finish == pBVar9) {
        lVar15 = (long)pBVar9 - (long)this_03;
        if (lVar15 == 0x7ffffffffffffff8) {
          local_a8.super__Vector_base<BlockDescriptor,_std::allocator<BlockDescriptor>_>._M_impl.
          super__Vector_impl_data._M_start = this_03;
          local_a8.super__Vector_base<BlockDescriptor,_std::allocator<BlockDescriptor>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = pBVar9;
          std::__throw_length_error("vector::_M_realloc_insert");
        }
        local_88 = (pointer)(lVar15 / 0x18);
        pBVar11 = local_88;
        if (pBVar9 == this_03) {
          pBVar11 = (pointer)0x1;
        }
        p_Var17 = (_Vector_base<BlockDescriptor,_std::allocator<BlockDescriptor>_> *)
                  ((long)&local_88->data_bits + (long)&pBVar11->data_bits);
        if ((_Vector_base<BlockDescriptor,_std::allocator<BlockDescriptor>_> *)0x555555555555554 <
            p_Var17) {
          p_Var17 = (_Vector_base<BlockDescriptor,_std::allocator<BlockDescriptor>_> *)
                    0x555555555555555;
        }
        if (CARRY8((ulong)pBVar11,(ulong)local_88)) {
          p_Var17 = (_Vector_base<BlockDescriptor,_std::allocator<BlockDescriptor>_> *)
                    0x555555555555555;
        }
        pBVar10 = std::_Vector_base<BlockDescriptor,_std::allocator<BlockDescriptor>_>::_M_allocate
                            (p_Var17,(size_t)__n_01);
        *(undefined8 *)((long)pBVar10 + lVar15 + 0x10) = 0;
        *(undefined8 *)((long)pBVar10 + lVar15) = 0;
        ((undefined8 *)((long)pBVar10 + lVar15))[1] = 0;
        pBVar16 = pBVar10;
        for (pBVar11 = this_03; pBVar11 != pBVar9; pBVar11 = pBVar11 + 1) {
          uVar8 = pBVar11->data_offset;
          pBVar16->default_gap_value = pBVar11->default_gap_value;
          pBVar16->data_offset = uVar8;
          uVar8 = pBVar11->gap_bits;
          uVar1 = pBVar11->gap_offset;
          bVar2 = pBVar11->is_mfm;
          bVar3 = pBVar11->has_forward_gap;
          bVar4 = pBVar11->has_backwards_gap;
          bVar5 = pBVar11->data_unit_is_bits;
          pBVar16->data_bits = pBVar11->data_bits;
          pBVar16->gap_bits = uVar8;
          pBVar16->gap_offset = uVar1;
          pBVar16->is_mfm = bVar2;
          pBVar16->has_forward_gap = bVar3;
          pBVar16->has_backwards_gap = bVar4;
          pBVar16->data_unit_is_bits = bVar5;
          pBVar16 = pBVar16 + 1;
        }
        std::_Vector_base<BlockDescriptor,_std::allocator<BlockDescriptor>_>::_M_deallocate
                  ((_Vector_base<BlockDescriptor,_std::allocator<BlockDescriptor>_> *)this_03,
                   local_88,__n_00);
        pBVar9 = pBVar10 + (long)p_Var17;
      }
      else {
        (local_a8.super__Vector_base<BlockDescriptor,_std::allocator<BlockDescriptor>_>._M_impl.
         super__Vector_impl_data._M_finish)->default_gap_value = 0;
        (local_a8.super__Vector_base<BlockDescriptor,_std::allocator<BlockDescriptor>_>._M_impl.
         super__Vector_impl_data._M_finish)->data_offset = 0;
        (local_a8.super__Vector_base<BlockDescriptor,_std::allocator<BlockDescriptor>_>._M_impl.
         super__Vector_impl_data._M_finish)->data_bits = 0;
        (local_a8.super__Vector_base<BlockDescriptor,_std::allocator<BlockDescriptor>_>._M_impl.
         super__Vector_impl_data._M_finish)->gap_bits = 0;
        (local_a8.super__Vector_base<BlockDescriptor,_std::allocator<BlockDescriptor>_>._M_impl.
         super__Vector_impl_data._M_finish)->gap_offset = 0;
        (local_a8.super__Vector_base<BlockDescriptor,_std::allocator<BlockDescriptor>_>._M_impl.
         super__Vector_impl_data._M_finish)->is_mfm = false;
        (local_a8.super__Vector_base<BlockDescriptor,_std::allocator<BlockDescriptor>_>._M_impl.
         super__Vector_impl_data._M_finish)->has_forward_gap = false;
        (local_a8.super__Vector_base<BlockDescriptor,_std::allocator<BlockDescriptor>_>._M_impl.
         super__Vector_impl_data._M_finish)->has_backwards_gap = false;
        (local_a8.super__Vector_base<BlockDescriptor,_std::allocator<BlockDescriptor>_>._M_impl.
         super__Vector_impl_data._M_finish)->data_unit_is_bits = false;
        pBVar16 = local_a8.super__Vector_base<BlockDescriptor,_std::allocator<BlockDescriptor>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        pBVar10 = this_03;
      }
      local_88 = pBVar16 + 1;
      local_a8.super__Vector_base<BlockDescriptor,_std::allocator<BlockDescriptor>_>._M_impl.
      super__Vector_impl_data._M_finish = local_88;
      uVar8 = FileHolder::get32be((FileHolder *)this_00);
      pBVar16->data_bits = uVar8;
      uVar8 = FileHolder::get32be((FileHolder *)this_00);
      pBVar16->gap_bits = uVar8;
      __n_01 = (_Base_ptr)0x8;
      if (*(char *)((long)local_80 + 0x130) == '\x01') {
        uVar8 = FileHolder::get32be((FileHolder *)this_00);
        pBVar16->gap_offset = uVar8;
        __n_01 = (_Base_ptr)0x4;
      }
      FileHolder::seek((FileHolder *)this_00,(long)__n_01,1);
      uVar8 = FileHolder::get32be((FileHolder *)this_00);
      pBVar16->is_mfm = uVar8 == 1;
      uVar8 = FileHolder::get32be((FileHolder *)this_00);
      bVar7 = (byte)uVar8;
      pBVar16->has_forward_gap = (bool)(bVar7 & 1);
      pBVar16->has_backwards_gap = (bool)(bVar7 >> 1 & 1);
      pBVar16->data_unit_is_bits = (bool)(bVar7 >> 2 & 1);
      uVar8 = FileHolder::get32be((FileHolder *)this_00);
      pBVar16->default_gap_value = uVar8;
      this_01 = this_00;
      uVar8 = FileHolder::get32be((FileHolder *)this_00);
      pBVar16->data_offset = uVar8;
      this_03 = pBVar10;
      uVar18 = (ulong)((int)local_78 + 1);
    }
    segments.
    super__Vector_base<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    segments.
    super__Vector_base<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    segments.
    super__Vector_base<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_78 = local_78 & 0xffffffff00000000;
    local_a8.super__Vector_base<BlockDescriptor,_std::allocator<BlockDescriptor>_>._M_impl.
    super__Vector_impl_data._M_start = this_03;
    local_a8.super__Vector_base<BlockDescriptor,_std::allocator<BlockDescriptor>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = pBVar9;
    for (; p_Var6 = local_70, this_03 != local_88; this_03 = this_03 + 1) {
      bit_length = IPF::bit_length(this_01,*(Density *)&local_70[1]._M_left,(int)local_78);
      if ((ulong)this_03->gap_offset == 0) {
        if ((ulong)this_03->gap_bits != 0) {
          add_gap(this_01,&segments,bit_length,(ulong)this_03->gap_bits,this_03->default_gap_value);
        }
      }
      else {
        FileHolder::seek((FileHolder *)this_00,
                         (long)&(p_Var6[1]._M_parent)->_M_color + (ulong)this_03->gap_offset,0);
        while (this_01 = this_00, bVar7 = FileHolder::get8((FileHolder *)this_00), bVar7 != 0) {
          sVar12 = anon_unknown.dwarf_10483b8::block_size((FileHolder *)this_00,bVar7);
          if ((bVar7 & 0x1f) == 1) {
            this_02 = "Adding gap length %zu bits\n";
            printf("Adding gap length %zu bits\n",sVar12);
            add_gap((IPF *)this_02,&segments,bit_length,sVar12,this_03->default_gap_value);
          }
          else {
            printf("Adding sampled gap length %zu bits\n",sVar12);
            add_raw_data((IPF *)local_80,&segments,bit_length,sVar12);
          }
        }
      }
      if ((ulong)this_03->data_offset != 0) {
        FileHolder::seek((FileHolder *)this_00,
                         (long)&(local_70[1]._M_parent)->_M_color + (ulong)this_03->data_offset,0);
        while (this_01 = this_00, bVar7 = FileHolder::get8((FileHolder *)this_00), bVar7 != 0) {
          sVar12 = anon_unknown.dwarf_10483b8::block_size((FileHolder *)this_00,bVar7);
          uVar18 = sVar12 << (this_03->data_unit_is_bits == false) * '\x03';
          lVar15 = FileHolder::tell((FileHolder *)this_00);
          bVar7 = bVar7 & 0x1f;
          if (bVar7 - 2 < 2) {
            add_unencoded_data((IPF *)local_80,&segments,bit_length,uVar18);
          }
          else if ((bVar7 == 1) || (bVar7 == 4)) {
            add_raw_data((IPF *)local_80,&segments,bit_length,uVar18);
          }
          else {
            printf("Unhandled data type %d, length %zu bits\n",(ulong)bVar7,uVar18);
          }
          lVar13 = FileHolder::tell((FileHolder *)this_00);
          if (lVar13 != (uVar18 >> 3) + lVar15) {
            __assert_fail("file_.tell() == next_chunk",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Storage/Disk/DiskImage/Formats/IPF.cpp"
                          ,0x135,
                          "virtual std::shared_ptr<Track> Storage::Disk::IPF::get_track_at_position(Track::Address)"
                         );
          }
        }
      }
      local_78 = CONCAT44(local_78._4_4_,(int)local_78 + 1);
    }
    std::
    make_shared<Storage::Disk::PCMTrack,std::vector<Storage::Disk::PCMSegment,std::allocator<Storage::Disk::PCMSegment>>&>
              ((vector<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_> *)
               &stack0xffffffffffffffb8);
    _Var14._M_pi = _Stack_40._M_pi;
    _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (this->super_DiskImage)._vptr_DiskImage = (_func_int **)local_48;
    (this->super_TypeDistinguisher)._vptr_TypeDistinguisher = (_func_int **)_Var14._M_pi;
    local_48 = (pointer)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&stack0xffffffffffffffc0);
    std::vector<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_>::~vector
              (&segments);
    std::vector<BlockDescriptor,_std::allocator<BlockDescriptor>_>::~vector(&local_a8);
    _Var14._M_pi = extraout_RDX_00;
  }
  sVar19.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var14._M_pi;
  sVar19.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<Storage::Disk::Track>)
         sVar19.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Track> IPF::get_track_at_position([[maybe_unused]] Track::Address address) {
	// Get the track description, if it exists, and check either that the file has contents for the track.
	auto pair = tracks_.find(address);
	if(pair == tracks_.end()) {
		return nullptr;
	}
	const TrackDescription &description = pair->second;
	if(!description.file_offset) {
		return nullptr;
	}

	// Seek to track content.
	file_.seek(description.file_offset, SEEK_SET);

	// Read the block descriptions up front.
	//
	// This is less efficient than just seeking for each block in turn,
	// but is a useful crutch to comprehension of the file format on a
	// first run through.
	struct BlockDescriptor {
		uint32_t data_bits = 0;
		uint32_t gap_bits = 0;
		uint32_t gap_offset = 0;
		bool is_mfm = false;
		bool has_forward_gap = false;
		bool has_backwards_gap = false;
		bool data_unit_is_bits = false;
		uint32_t default_gap_value = 0;
		uint32_t data_offset = 0;
	};
	std::vector<BlockDescriptor> blocks;
	blocks.reserve(description.block_count);
	for(uint32_t c = 0; c < description.block_count; c++) {
		auto &block = blocks.emplace_back();
		block.data_bits = file_.get32be();
		block.gap_bits = file_.get32be();
		if(is_sps_format_) {
			block.gap_offset = file_.get32be();
			file_.seek(4, SEEK_CUR);	// Skip 'cell type' which appears to provide no content.
		} else {
			// Skip potlower-resolution copies of data_bits and gap_bits.
			file_.seek(8, SEEK_CUR);
		}
		block.is_mfm = file_.get32be() == 1;

		const uint32_t flags = file_.get32be();
		block.has_forward_gap = flags & 1;
		block.has_backwards_gap = flags & 2;
		block.data_unit_is_bits = flags & 4;

		block.default_gap_value = file_.get32be();
		block.data_offset = file_.get32be();
	}

	std::vector<Storage::Disk::PCMSegment> segments;
	int block_count = 0;
	for(auto &block: blocks) {
		const auto length_of_a_bit = bit_length(description.density, block_count);

		if(block.gap_offset) {
			file_.seek(description.file_offset + block.gap_offset, SEEK_SET);
			while(true) {
				const uint8_t gap_header = file_.get8();
				if(!gap_header) break;

				// Decompose the header and read the length.
				enum class Type {
					None, GapLength, SampleLength
				} type = Type(gap_header & 0x1f);
				const size_t length = block_size(file_, gap_header);

				switch(type) {
					case Type::GapLength:
						printf("Adding gap length %zu bits\n", length);
						add_gap(segments, length_of_a_bit, length, block.default_gap_value);
					break;

					default:
					case Type::SampleLength:
						printf("Adding sampled gap length %zu bits\n", length);
						add_raw_data(segments, length_of_a_bit, length);
//						file_.seek(long(length >> 3), SEEK_CUR);
					break;
				}
			}
		} else if(block.gap_bits) {
			add_gap(segments, length_of_a_bit, block.gap_bits, block.default_gap_value);
		}

		if(block.data_offset) {
			file_.seek(description.file_offset + block.data_offset, SEEK_SET);
			while(true) {
				const uint8_t data_header = file_.get8();
				if(!data_header) break;

				// Decompose the header and read the length.
				enum class Type {
					None, Sync, Data, Gap, Raw, Fuzzy
				} type = Type(data_header & 0x1f);
				const size_t length = block_size(file_, data_header) * (block.data_unit_is_bits ? 1 : 8);
#ifndef NDEBUG
				const auto next_chunk = file_.tell() + long(length >> 3);
#endif

				switch(type) {
					case Type::Gap:
					case Type::Data:
						add_unencoded_data(segments, length_of_a_bit, length);
					break;

					case Type::Sync:
					case Type::Raw:
						add_raw_data(segments, length_of_a_bit, length);
					break;

					default:
						printf("Unhandled data type %d, length %zu bits\n", int(type), length);
					break;
				}

				assert(file_.tell() == next_chunk);
			}
		}

		++block_count;
	}

	return std::make_shared<Storage::Disk::PCMTrack>(segments);
}